

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
::checkAndThrowErrorIfCycleFound
          (GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
           *this)

{
  bool bVar1;
  reference this_00;
  Context *in_RCX;
  Context local_78;
  reference local_58;
  Node *n;
  const_iterator __end0;
  const_iterator __begin0;
  vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
  *__range3;
  undefined1 local_28 [8];
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  visitedStack;
  GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
  *this_local;
  
  visitedStack.
  super__Vector_base<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  ::vector((vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
            *)local_28);
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  ::reserve((vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
             *)local_28,0x100);
  __end0 = std::
           vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
           ::begin(&this->nodes);
  n = (Node *)std::
              vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
              ::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>_>
                                *)&n);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>_>
              ::operator*(&__end0);
    local_78.location.sourceCode.object = (SourceCodeText *)0x0;
    local_78.location.location.data = (char *)0x0;
    local_58 = this_00;
    CodeLocation::CodeLocation(&local_78.location);
    local_78.parentScope = (Scope *)0x0;
    check((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
           *)this_00,(Node *)local_28,
          (vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
           *)&local_78,in_RCX);
    AST::Context::~Context(&local_78);
    bVar1 = std::
            vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
            ::empty((vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
                     *)local_28);
    in_RCX = (Context *)0x186;
    checkAssertion(bVar1,"visitedStack.empty()","checkAndThrowErrorIfCycleFound",0x186);
    __gnu_cxx::
    __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
  ::~vector((vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
             *)local_28);
  return;
}

Assistant:

void checkAndThrowErrorIfCycleFound() const
        {
            std::vector<const Node*> visitedStack;
            visitedStack.reserve (256);

            for (auto& n : nodes)
            {
                check (n, visitedStack, {});
                SOUL_ASSERT (visitedStack.empty());
            }
        }